

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O2

void i2cp_offer(i2cp_state *state,uint8_t *data,ssize_t sz)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint sz_00;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar1 = (state->readcur).buf;
  while( true ) {
    if (sz == 0) {
      i2cp_flush_read(state);
      return;
    }
    if ((sz < 0) || (uVar3 = (ulong)(state->readcur).sz, 0xffff < sz + uVar3)) {
      return;
    }
    memcpy(puVar1 + uVar3,data,sz);
    uVar4 = (int)sz + (state->readcur).sz;
    (state->readcur).sz = uVar4;
    if (uVar4 < 5) {
      return;
    }
    uVar5 = *(uint *)puVar1;
    sz_00 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = sz_00 + 5;
    if (uVar4 < uVar5) break;
    i2cp_ringbuf_append(&state->readbuf,(state->readcur).buf[4],(state->readcur).buf + 5,sz_00);
    uVar2 = (state->readcur).sz;
    (state->readcur).sz = 0;
    uVar5 = uVar2 - uVar5;
    sz = (ssize_t)uVar5;
    if (uVar5 == 0) {
      return;
    }
    data = puVar1 + sz;
  }
  return;
}

Assistant:

void i2cp_offer(struct i2cp_state * state, uint8_t * data, ssize_t sz)
{
  if(sz == 0)
  {
    i2cp_flush_read(state);
    return;
  }
  if(sz < 0) return;
  
  if(sizeof(state->readcur.buf) <= state->readcur.sz + sz)
  {
    return;
  }
  memcpy(state->readcur.buf + state->readcur.sz, data, sz);
  state->readcur.sz += sz;
  

  if(state->readcur.sz > 4)
  {
    uint32_t curlen = bufbe32toh(state->readcur.buf);
    if( curlen + 5 <= state->readcur.sz)
    {
      i2cp_ringbuf_append(&state->readbuf, state->readcur.buf[4], state->readcur.buf + 5, curlen);
      ssize_t diff = state->readcur.sz - (curlen + 5);
      state->readcur.sz = 0;
      if(diff > 0)
        i2cp_offer(state, state->readcur.buf + diff, diff);
    }
  }
}